

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutil.hpp
# Opt level: O3

void REQUIRE_EQUAL(uint32_t *a,uint32_t *b,size_t n,string *name)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  
  if (n != 0) {
    sVar4 = 0;
    iVar3 = 0;
    do {
      uVar1 = a[sVar4];
      uVar2 = b[sVar4];
      if (uVar1 != uVar2) {
        iVar3 = iVar3 + 1;
        if (iVar3 == 5) {
          quit("%s not equal at position %lu/%lu -> expected=%u is=%u",(name->_M_dataplus)._M_p,
               sVar4,n - 1,(ulong)uVar1,(ulong)uVar2);
        }
        fprintf(_stderr,"%s not equal at position %lu/%lu -> expected=%u is=%u\n",
                (name->_M_dataplus)._M_p,sVar4,n - 1,(ulong)uVar1,uVar2);
      }
      sVar4 = sVar4 + 1;
    } while (n != sVar4);
    if (iVar3 != 0) {
      quit("NOT EQUAL!");
    }
  }
  return;
}

Assistant:

void REQUIRE_EQUAL(
    const uint32_t* a, const uint32_t* b, size_t n, std::string name)
{
    int errors = 0;
    for (size_t i = 0; i < n; i++) {
        if (a[i] != b[i]) {
            errors++;
            if (errors == 5) {
                quit("%s not equal at position %lu/%lu -> expected=%u is=%u",
                    name.c_str(), i, n - 1, a[i], b[i]);
            } else {
                fprintf(stderr,
                    "%s not equal at position %lu/%lu -> expected=%u is=%u\n",
                    name.c_str(), i, n - 1, a[i], b[i]);
            }
        }
    }
    if (errors != 0) {
        quit("NOT EQUAL!");
    }
}